

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbuserror.cpp
# Opt level: O1

void __thiscall QDBusError::QDBusError(QDBusError *this,ErrorType error,QString *mess)

{
  char *pcVar1;
  ErrorType EVar2;
  ulong uVar3;
  long lVar4;
  QLatin1String QVar5;
  
  this->code = error;
  EVar2 = InvalidService|NoReply;
  if ((int)error < 0x1d) {
    EVar2 = error;
  }
  uVar3 = 0;
  if (0 < (int)EVar2) {
    uVar3 = (ulong)EVar2;
  }
  (this->msg).d.d = (Data *)0x0;
  (this->msg).d.ptr = (char16_t *)0x0;
  (this->msg).d.size = 0;
  (this->nm).d.d = (Data *)0x0;
  (this->nm).d.ptr = (char16_t *)0x0;
  (this->nm).d.size = 0;
  uVar3 = (ulong)errorMessages.m_offsets._M_elems[uVar3];
  QVar5.m_data = errorMessages.m_string._M_elems + uVar3;
  lVar4 = -1;
  do {
    pcVar1 = (char *)(uVar3 + 0x19a721 + lVar4);
    lVar4 = lVar4 + 1;
  } while (*pcVar1 != '\0');
  QVar5.m_size = lVar4;
  QString::operator=(&this->nm,QVar5);
  QString::operator=(&this->msg,mess);
  return;
}

Assistant:

QDBusError::QDBusError(ErrorType error, const QString &mess)
    : code(error)
{
    nm = QLatin1StringView(errorMessages[error]);
    msg = mess;
}